

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManage.cpp
# Opt level: O3

bool free_memory(uint adr,int type)

{
  uint uVar1;
  MemoryNode *pMVar2;
  MemoryNode *pMVar3;
  MemoryNode **ppMVar4;
  MemoryNode *pMVar5;
  MemoryNode **ppMVar6;
  MemoryNode *pMVar7;
  
  if (type == 0) {
    ppMVar4 = &data_free_memory_head;
    ppMVar6 = &data_used_memory_head;
  }
  else {
    if (type != 1) {
      return false;
    }
    ppMVar4 = &code_free_memory_head;
    ppMVar6 = &code_used_memory_head;
  }
  pMVar7 = *ppMVar6;
  if (pMVar7 != (MemoryNode *)0x0) {
    pMVar2 = *ppMVar4;
    do {
      if (pMVar7->address == adr) {
        uVar1 = pMVar7->size;
        pMVar5 = pMVar7->forward;
        pMVar3 = pMVar7->next;
        pMVar5->next = pMVar3;
        if (pMVar3 != (MemoryNode *)0x0) {
          pMVar3->forward = pMVar5;
        }
        operator_delete(pMVar7,0x20);
        pMVar7 = pMVar2->next;
        pMVar5 = (MemoryNode *)operator_new(0x20);
        pMVar5->address = adr;
        pMVar5->size = uVar1;
        pMVar5->forward = pMVar2;
        pMVar5->next = pMVar7;
        pMVar2->next = pMVar5;
        pMVar7->forward = pMVar5;
        return true;
      }
      pMVar7 = pMVar7->next;
    } while (pMVar7 != (MemoryNode *)0x0);
  }
  return false;
}

Assistant:

EXPORT bool free_memory(unsigned adr,int type) {
	MemoryNode *used_head=nullptr, *free_head = nullptr;
	init_get_head(type, free_head, used_head);
	MemoryNode * used = used_head;
	unsigned adr_size;
	while (used) //获取使用的链表
	{
		if (used->address == adr) break;
		else used = used->next;
	}
	if (!used) return false;
	else
	{
		adr_size = used->size;
		/*从使用链表中取下*/
		MemoryNode *forword = used->forward;
		MemoryNode *next = used->next;
		forword->next = used->next;
		if (next) next->forward = forword;
		delete(used);

		/*加入未使用的节点采用头插入*/

		MemoryNode *data_first = free_head->next;
		MemoryNode *new_free = new MemoryNode;
		new_free->address = adr;
		new_free->size = adr_size;
		new_free->forward = free_head;
		new_free->next = data_first;
		free_head->next = new_free;
		data_first->forward = new_free;

		return true;
	}
}